

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

void __thiscall node::anon_unknown_2::RpcHandlerImpl::~RpcHandlerImpl(RpcHandlerImpl *this)

{
  Actor *pAVar1;
  long lVar2;
  _Manager_type p_Var3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_Handler)._vptr_Handler = (_func_int **)&PTR__RpcHandlerImpl_00b39488;
  if (this->m_wrapped_command != (CRPCCommand *)0x0) {
    this->m_wrapped_command = (CRPCCommand *)0x0;
    CRPCTable::removeCommand(&tableRPC,&(this->m_command).name,&this->m_command);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector(&(this->m_command).argNames);
  p_Var3 = (this->m_command).actor.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pAVar1 = &(this->m_command).actor;
    (*p_Var3)((_Any_data *)pAVar1,(_Any_data *)pAVar1,__destroy_functor);
  }
  pcVar4 = (this->m_command).name._M_dataplus._M_p;
  paVar5 = &(this->m_command).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->m_command).category._M_dataplus._M_p;
  paVar5 = &(this->m_command).category.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar5) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~RpcHandlerImpl() override { disconnect(); }